

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O3

void __thiscall SCCLiveness::ExtendLifetime(SCCLiveness *this,Lifetime *lifetime,Instr *instr)

{
  RealCount *pRVar1;
  uint uVar2;
  uint uVar3;
  StackSym *pSVar4;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *pSVar5;
  JitArenaAllocator *this_00;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  code *pcVar7;
  Instr *pIVar8;
  Lifetime *pLVar9;
  bool bVar10;
  BOOLEAN BVar11;
  uint uVar12;
  uint32 uVar13;
  undefined4 *puVar14;
  undefined7 extraout_var;
  Type pSVar15;
  Type *ppLVar16;
  uint uVar17;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *buffer;
  SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *pSVar18;
  Loop *pLVar19;
  SCCLiveness *this_01;
  Iterator local_60;
  Instr *local_50;
  ulong local_48;
  Lifetime *local_40;
  SCCLiveness *local_38;
  
  if (lifetime == (Lifetime *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a7,"(lifetime != nullptr)","Lifetime not provided");
    if (!bVar10) goto LAB_0062298e;
    *puVar14 = 0;
  }
  if (lifetime->sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a8,"(lifetime->sym != nullptr)","Lifetime has no symbol");
    if (!bVar10) goto LAB_0062298e;
    *puVar14 = 0;
  }
  local_50 = instr;
  if ((SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->extendedLifetimesLoopList->super_SListNodeBase<Memory::ArenaAllocator>).next !=
      this->extendedLifetimesLoopList) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar14 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                        ,0x2a9,"(this->extendedLifetimesLoopList->Empty())",
                        "this->extendedLifetimesLoopList->Empty()");
    if (!bVar10) goto LAB_0062298e;
    *puVar14 = 0;
  }
  pLVar19 = this->curLoop;
  local_38 = this;
  if (pLVar19 != (Loop *)0x0) {
    uVar13 = lifetime->end;
    uVar17 = lifetime->start;
    pSVar4 = lifetime->sym;
    local_48 = 0;
    local_40 = lifetime;
    do {
      BVar11 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((pLVar19->regAlloc).liveOnBackEdgeSyms,(pSVar4->super_Sym).m_id);
      if (BVar11 != '\0') {
        uVar2 = (pLVar19->regAlloc).loopStart;
        if (uVar2 < uVar17) {
          pSVar18 = local_38->extendedLifetimesLoopList;
          pSVar15 = (Type)new<Memory::ArenaAllocator>
                                    (0x10,&local_38->tempAlloc->super_ArenaAllocator,0x364470);
          pSVar15[1].next = (Type)pLVar19;
          pSVar15->next = (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next;
          (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar15;
          (pSVar18->super_RealCount).count = (pSVar18->super_RealCount).count + 1;
          uVar17 = (pLVar19->regAlloc).loopEnd;
          if (uVar13 < uVar17) {
            uVar13 = uVar17;
          }
          local_48 = CONCAT71((uint7)(uint3)(uVar17 >> 8),1);
          uVar17 = uVar2;
        }
        else {
          uVar2 = (pLVar19->regAlloc).loopEnd;
          local_48 = CONCAT71(extraout_var,1);
          if (uVar13 < uVar2) {
            pSVar18 = local_38->extendedLifetimesLoopList;
            pSVar15 = (Type)new<Memory::ArenaAllocator>
                                      (0x10,&local_38->tempAlloc->super_ArenaAllocator,0x364470);
            pSVar15[1].next = (Type)pLVar19;
            pSVar15->next = (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next;
            (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar15;
            (pSVar18->super_RealCount).count = (pSVar18->super_RealCount).count + 1;
            uVar13 = uVar2;
          }
        }
      }
      pLVar19 = pLVar19->parent;
    } while (pLVar19 != (Loop *)0x0);
    lifetime = local_40;
    if ((local_48 & 1) != 0) {
      if (uVar17 < local_40->start) {
        local_40->start = uVar17;
        if (local_40->end < uVar13) {
LAB_006227e6:
          local_40->end = uVar13;
        }
        pSVar18 = local_38->extendedLifetimesLoopList;
        local_60.list = pSVar18;
        local_60.current = &pSVar18->super_SListNodeBase<Memory::ArenaAllocator>;
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        while( true ) {
          if (pSVar18 == (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar14 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar10) goto LAB_0062298e;
            *puVar14 = 0;
            pSVar18 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)local_60.current;
          }
          pSVar18 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
                    (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if (pSVar18 == local_60.list) break;
          local_60.current = (NodeBase *)pSVar18;
          ppLVar16 = SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_60)
          ;
          pSVar5 = ((*ppLVar16)->regAlloc).extendedLifetime;
          pSVar15 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar5->allocator,0x364470);
          pSVar15[1].next = (Type)local_40;
          pSVar15->next =
               (pSVar5->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
          (pSVar5->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
          super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar15;
          pRVar1 = &(pSVar5->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
                    super_RealCount;
          pRVar1->count = pRVar1->count + 1;
          pSVar18 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)local_60.current;
        }
      }
      else if (local_40->end < uVar13) goto LAB_006227e6;
      pLVar9 = local_40;
      pIVar8 = local_50;
      bVar10 = IR::Instr::HasLazyBailOut(local_50);
      this_01 = local_38;
      if (((bVar10) ||
          (uVar17 = pLVar9->end, uVar13 = IR::Instr::GetNumber(pIVar8), uVar17 <= uVar13)) &&
         ((bVar10 = IR::Instr::HasLazyBailOut(pIVar8), !bVar10 ||
          (uVar17 = pLVar9->end, uVar13 = IR::Instr::GetNumber(pIVar8), uVar17 < uVar13)))) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SccLiveness.cpp"
                            ,0x2f9,
                            "((!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) || (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()))"
                            ,"Lifetime end not set correctly");
        if (!bVar10) {
LAB_0062298e:
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        *puVar14 = 0;
      }
      goto LAB_0062294c;
    }
  }
  pIVar8 = local_50;
  uVar17 = lifetime->end;
  uVar13 = IR::Instr::GetNumber(local_50);
  this_01 = local_38;
  if (uVar17 < uVar13) {
    uVar13 = IR::Instr::GetNumber(pIVar8);
    lifetime->end = uVar13;
    uVar3 = this_01->totalOpHelperFullVisitedLength;
    uVar12 = CurrentOpHelperVisitedLength(this_01,pIVar8);
    lifetime->totalOpHelperLengthByEnd = uVar12 + uVar3;
  }
LAB_0062294c:
  pSVar18 = this_01->extendedLifetimesLoopList;
  buffer = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
           (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (buffer != pSVar18) {
    this_00 = this_01->tempAlloc;
    do {
      pSVar6 = (SListBase<Loop_*,_Memory::ArenaAllocator,_RealCount> *)
               (buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                 buffer,0x10);
      buffer = pSVar6;
    } while (pSVar6 != pSVar18);
  }
  (pSVar18->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar18->super_SListNodeBase<Memory::ArenaAllocator>;
  (pSVar18->super_RealCount).count = 0;
  return;
}

Assistant:

void
SCCLiveness::ExtendLifetime(Lifetime *lifetime, IR::Instr *instr)
{
    AssertMsg(lifetime != nullptr, "Lifetime not provided");
    AssertMsg(lifetime->sym != nullptr, "Lifetime has no symbol");
    Assert(this->extendedLifetimesLoopList->Empty());

    // Find the loop that we need to extend the lifetime to
    StackSym * sym = lifetime->sym;
    Loop * loop = this->curLoop;
    uint32 extendedLifetimeStart = lifetime->start;
    uint32 extendedLifetimeEnd = lifetime->end;
    bool isLiveOnBackEdge = false;
    bool loopAddedToList = false;

    while (loop)
    {
        if (loop->regAlloc.liveOnBackEdgeSyms->Test(sym->m_id))
        {
            isLiveOnBackEdge = true;
            if (loop->regAlloc.loopStart < extendedLifetimeStart)
            {
                extendedLifetimeStart = loop->regAlloc.loopStart;
                this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                loopAddedToList = true;
            }
            if (loop->regAlloc.loopEnd > extendedLifetimeEnd)
            {
                extendedLifetimeEnd = loop->regAlloc.loopEnd;
                if (!loopAddedToList)
                {
                    this->extendedLifetimesLoopList->Prepend(this->tempAlloc, loop);
                }
            }
        }
        loop = loop->parent;
        loopAddedToList = false;
    }

    if (!isLiveOnBackEdge)
    {
        // Don't extend lifetime to loop boundary if the use are not live on back edge
        // Note: the above loop doesn't detect a reg that is live on an outer back edge
        // but not an inner one, so we can't assume here that the lifetime hasn't been extended
        // past the current instruction.
        if (lifetime->end < instr->GetNumber())
        {
            lifetime->end = instr->GetNumber();
            lifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(instr);
        }
    }
    else
    {
        // extend lifetime to the outer most loop boundary that have the symbol live on back edge.
        bool isLifetimeExtended = false;
        if (lifetime->start > extendedLifetimeStart)
        {
            isLifetimeExtended = true;
            lifetime->start = extendedLifetimeStart;
        }

        if (lifetime->end < extendedLifetimeEnd)
        {
            isLifetimeExtended = true;
            lifetime->end = extendedLifetimeEnd;
            // The total op helper length by the end of this lifetime will be updated once we reach the loop tail
        }

        if (isLifetimeExtended)
        {
            // Keep track of the lifetime extended for this loop so we can update the call bits
            FOREACH_SLISTBASE_ENTRY(Loop *, currLoop, this->extendedLifetimesLoopList)
            {
                currLoop->regAlloc.extendedLifetime->Prepend(lifetime);
            }
            NEXT_SLISTBASE_ENTRY
        }
#if _M_ARM64
        // The case of equality is valid on Arm64 where some branch instructions have sources.
        AssertMsg(lifetime->end >= instr->GetNumber(), "Lifetime end not set correctly");
#else
        AssertMsg(
            (!instr->HasLazyBailOut() && lifetime->end > instr->GetNumber()) ||
            (instr->HasLazyBailOut() && lifetime->end >= instr->GetNumber()),
            "Lifetime end not set correctly"
        );
#endif
    }
    this->extendedLifetimesLoopList->Clear(this->tempAlloc);
}